

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Update
          (PersistentStorageJson *this,BorderRouter *aValue)

{
  Status SVar1;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)JSON_BR_abi_cxx11_);
  SVar1 = UpdId<ot::commissioner::persistent_storage::BorderRouter>(this,aValue,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Update(BorderRouter const &aValue)
{
    return UpdId<BorderRouter>(aValue, JSON_BR);
}